

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureCubeSizeCase::init(TextureCubeSizeCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  int iVar2;
  TextureCube *this_00;
  ulong uVar3;
  uint uVar4;
  int face;
  long lVar5;
  long lVar6;
  int levelNdx;
  ulong uVar7;
  Vec4 (*minVal) [2];
  
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width);
  this->m_texture = this_00;
  if (init()::gradients == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::gradients);
    if (iVar2 != 0) {
      init::gradients[0][0].m_data[0] = _DAT_018011a0;
      init::gradients[0][0].m_data[1] = _UNK_018011a4;
      init::gradients[0][0].m_data[2] = _UNK_018011a8;
      init::gradients[0][0].m_data[3] = _UNK_018011ac;
      init::gradients[0][1].m_data[0] = _DAT_01801120;
      init::gradients[0][1].m_data[1] = _UNK_01801124;
      init::gradients[0][1].m_data[2] = _UNK_01801128;
      init::gradients[0][1].m_data[3] = _UNK_0180112c;
      init::gradients[1][0].m_data[0] = _DAT_018011b0;
      init::gradients[1][0].m_data[1] = _UNK_018011b4;
      init::gradients[1][0].m_data[2] = _UNK_018011b8;
      init::gradients[1][0].m_data[3] = _UNK_018011bc;
      init::gradients[1][1].m_data[0] = _DAT_01801120;
      init::gradients[1][1].m_data[1] = _UNK_01801124;
      init::gradients[1][1].m_data[2] = _UNK_01801128;
      init::gradients[1][1].m_data[3] = _UNK_0180112c;
      init::gradients[2][0].m_data[0] = _DAT_018011c0;
      init::gradients[2][0].m_data[1] = _UNK_018011c4;
      init::gradients[2][0].m_data[2] = _UNK_018011c8;
      init::gradients[2][0].m_data[3] = _UNK_018011cc;
      init::gradients[2][1].m_data[0] = _DAT_01801120;
      init::gradients[2][1].m_data[1] = _UNK_01801124;
      init::gradients[2][1].m_data[2] = _UNK_01801128;
      init::gradients[2][1].m_data[3] = _UNK_0180112c;
      init::gradients[3][0].m_data[0] = _DAT_018011d0;
      init::gradients[3][0].m_data[1] = _UNK_018011d4;
      init::gradients[3][0].m_data[2] = _UNK_018011d8;
      init::gradients[3][0].m_data[3] = _UNK_018011dc;
      init::gradients[3][1].m_data[0] = _DAT_01801120;
      init::gradients[3][1].m_data[1] = _UNK_01801124;
      init::gradients[3][1].m_data[2] = _UNK_01801128;
      init::gradients[3][1].m_data[3] = _UNK_0180112c;
      init::gradients[4][0].m_data[0] = _DAT_018011e0;
      init::gradients[4][0].m_data[1] = _UNK_018011e4;
      init::gradients[4][0].m_data[2] = _UNK_018011e8;
      init::gradients[4][0].m_data[3] = _UNK_018011ec;
      init::gradients[4][1].m_data[0] = _DAT_01675840;
      init::gradients[4][1].m_data[1] = _UNK_01675844;
      init::gradients[4][1].m_data[2] = _UNK_01675848;
      init::gradients[4][1].m_data[3] = _UNK_0167584c;
      init::gradients[5][0].m_data[0] = _DAT_018011f0;
      init::gradients[5][0].m_data[1] = _UNK_018011f4;
      init::gradients[5][0].m_data[2] = _UNK_018011f8;
      init::gradients[5][0].m_data[3] = _UNK_018011fc;
      init::gradients[5][1].m_data[0] = _DAT_01801120;
      init::gradients[5][1].m_data[1] = _UNK_01801124;
      init::gradients[5][1].m_data[2] = _UNK_01801128;
      init::gradients[5][1].m_data[3] = _UNK_0180112c;
      __cxa_guard_release(&init()::gradients);
    }
  }
  if (this->m_useMipmaps == true) {
    uVar1 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar1 = this->m_width;
    }
    uVar4 = 0x20;
    if (uVar1 != 0) {
      uVar4 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    uVar3 = (ulong)(0x20 - uVar4);
  }
  else {
    uVar3 = 1;
  }
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    minVal = init::gradients;
    lVar6 = 0;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)lVar5,(int)uVar7);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)((long)&(this->m_texture->m_refTexture).m_access[0].
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar6) + uVar7 * 0x28
                 ),*minVal,(Vec4 *)((long)minVal + 0x10));
      lVar6 = lVar6 + 0x18;
      minVal = (Vec4 (*) [2])((long)minVal + 0x20);
    }
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  return extraout_EAX;
}

Assistant:

void TextureCubeSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	DE_ASSERT(m_width == m_height);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_width);

	static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
	{
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
		{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
		{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
		{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
	};

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
			fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0], gradients[face][1]);
		}
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}